

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationsInfo.cpp
# Opt level: O2

void __thiscall ezc3d::DataNS::RotationNS::Info::Info(Info *this,c3d *c3d)

{
  bool bVar1;
  PROCESSOR_TYPE PVar2;
  Parameters *pPVar3;
  Group *this_00;
  Parameter *pPVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  Header *this_01;
  ulong uVar7;
  runtime_error *this_02;
  float fVar8;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  double local_38;
  undefined8 uStack_30;
  
  this->_hasGroup = false;
  this->_dataStart = 0xffffffffffffffff;
  this->_used = 0;
  this->_ratio = 0;
  pPVar3 = ezc3d::c3d::parameters(c3d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ROTATION",(allocator<char> *)&local_58);
  bVar1 = ParametersNS::Parameters::isGroup(pPVar3,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if (!bVar1) {
    return;
  }
  this->_hasGroup = true;
  pPVar3 = ezc3d::c3d::parameters(c3d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ROTATION",(allocator<char> *)&local_58);
  this_00 = ParametersNS::Parameters::group(pPVar3,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"DATA_START",(allocator<char> *)&local_58);
  bVar1 = ParametersNS::GroupNS::Group::isParameter(this_00,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"DATA_START",(allocator<char> *)&local_58);
    pPVar4 = ParametersNS::GroupNS::Group::parameter(this_00,&local_78);
    pvVar5 = ParametersNS::GroupNS::Parameter::valuesAsInt(pPVar4);
    this->_dataStart =
         (long)*(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"USED",(allocator<char> *)&local_58);
    bVar1 = ParametersNS::GroupNS::Group::isParameter(this_00,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"USED",(allocator<char> *)&local_58);
      pPVar4 = ParametersNS::GroupNS::Group::parameter(this_00,&local_78);
      pvVar5 = ParametersNS::GroupNS::Parameter::valuesAsInt(pPVar4);
      this->_used = (long)*(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"RATIO",&local_79);
      bVar1 = ParametersNS::GroupNS::Group::isParameter(this_00,&local_78);
      if (bVar1) {
        std::__cxx11::string::~string((string *)&local_78);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"RATE",&local_7a);
        bVar1 = ParametersNS::GroupNS::Group::isParameter(this_00,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_78);
        if (!bVar1) {
          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_02,"RATIO or RATE must be present in ROTATION.");
          goto LAB_00131987;
        }
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"RATIO",&local_79);
      bVar1 = ParametersNS::GroupNS::Group::isParameter(this_00,&local_78);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"RATIO",&local_7a);
        pPVar4 = ParametersNS::GroupNS::Group::parameter(this_00,&local_58);
        pvVar5 = ParametersNS::GroupNS::Parameter::valuesAsInt(pPVar4);
        this->_ratio = (ulong)(uint)*(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                     .super__Vector_impl_data._M_start;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"RATE",&local_7a);
        pPVar4 = ParametersNS::GroupNS::Group::parameter(this_00,&local_58);
        pvVar6 = ParametersNS::GroupNS::Parameter::valuesAsDouble(pPVar4);
        local_38 = *(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        uStack_30 = 0;
        this_01 = ezc3d::c3d::header(c3d);
        fVar8 = Header::frameRate(this_01);
        uVar7 = (ulong)(local_38 / (double)fVar8);
        this->_ratio = (long)(local_38 / (double)fVar8 - 9.223372036854776e+18) &
                       (long)uVar7 >> 0x3f | uVar7;
      }
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      pPVar3 = ezc3d::c3d::parameters(c3d);
      PVar2 = ParametersNS::Parameters::processorType(pPVar3);
      this->_processorType = PVar2;
      return;
    }
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"USED is not present in ROTATION.");
  }
  else {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"DATA_START is not present in ROTATION.");
  }
LAB_00131987:
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ezc3d::DataNS::RotationNS::Info::Info(const ezc3d::c3d &c3d)
    : _hasGroup(false), _dataStart(-1), _used(0), _ratio(0) {
  if (!c3d.parameters().isGroup("ROTATION")) {
    return;
  }
  _hasGroup = true;

  const ezc3d::ParametersNS::GroupNS::Group &group =
      c3d.parameters().group("ROTATION");

  // Do a sanity check before accessing
  if (!group.isParameter("DATA_START")) {
    throw std::runtime_error("DATA_START is not present in ROTATION.");
  }
  _dataStart = group.parameter("DATA_START").valuesAsInt()[0];

  if (!group.isParameter("USED")) {
    throw std::runtime_error("USED is not present in ROTATION.");
  }
  _used = group.parameter("USED").valuesAsInt()[0];

  if (!group.isParameter("RATIO") && !group.isParameter("RATE")) {
    throw std::runtime_error("RATIO or RATE must be present in ROTATION.");
  }
  _ratio = static_cast<size_t>(
      group.isParameter("RATIO") ? group.parameter("RATIO").valuesAsInt()[0]
                                 : group.parameter("RATE").valuesAsDouble()[0] /
                                       c3d.header().frameRate());

  _processorType = c3d.parameters().processorType();
}